

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

int cimg_library::cimg::system(char *__command)

{
  int iVar1;
  size_t sVar2;
  char *__command_00;
  int in_EDX;
  ulong __n;
  
  if (in_EDX != 0) {
    iVar1 = ::system(__command);
    return iVar1;
  }
  sVar2 = strlen(__command);
  __n = sVar2 & 0xffffffff;
  if (__n == 0) {
    iVar1 = -1;
  }
  else {
    __command_00 = (char *)operator_new__((ulong)((int)sVar2 + 0x18));
    memcpy(__command_00,__command,__n);
    builtin_strncpy(__command_00 + __n," >/dev/null 2>&1",0x11);
    iVar1 = ::system(__command_00);
    operator_delete__(__command_00);
  }
  return iVar1;
}

Assistant:

inline int system(const char *const command, const char *const module_name=0, const bool is_verbose=false) {
      cimg::unused(module_name);
#ifdef cimg_no_system_calls
      return -1;
#else
      if (is_verbose) return std::system(command);
#if cimg_OS==1
      const unsigned int l = (unsigned int)std::strlen(command);
      if (l) {
        char *const ncommand = new char[l + 24];
        std::memcpy(ncommand,command,l);
        std::strcpy(ncommand + l," >/dev/null 2>&1"); // Make command silent
        const int out_val = std::system(ncommand);
        delete[] ncommand;
        return out_val;
      } else return -1;
#elif cimg_OS==2
      PROCESS_INFORMATION pi;
      STARTUPINFO si;
      std::memset(&pi,0,sizeof(PROCESS_INFORMATION));
      std::memset(&si,0,sizeof(STARTUPINFO));
      GetStartupInfo(&si);
      si.cb = sizeof(si);
      si.wShowWindow = SW_HIDE;
      si.dwFlags |= SW_HIDE | STARTF_USESHOWWINDOW;
      const BOOL res = CreateProcess((LPCTSTR)module_name,(LPTSTR)command,0,0,FALSE,0,0,0,&si,&pi);
      if (res) {
        WaitForSingleObject(pi.hProcess,INFINITE);
        CloseHandle(pi.hThread);
        CloseHandle(pi.hProcess);
        return 0;
      } else return std::system(command);
#else
      return std::system(command);
#endif
#endif
    }